

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.cpp
# Opt level: O0

string * __thiscall
Test::Suite::toPrettyTypeName_abi_cxx11_(string *__return_storage_ptr__,Suite *this,type_info *type)

{
  bool bVar1;
  char *pcVar2;
  pointer __p;
  char *local_78;
  _func_void_void_ptr *local_48;
  undefined1 local_40 [8];
  unique_ptr<char,_void_(*)(void_*)> owner;
  allocator<char> local_1a;
  byte local_19;
  Suite *local_18;
  type_info *type_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  type_local = (type_info *)__return_storage_ptr__;
  pcVar2 = std::type_info::name((type_info *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  pcVar2 = std::type_info::name((type_info *)local_18);
  __p = (pointer)__cxa_demangle(pcVar2,0,0);
  local_48 = free;
  std::unique_ptr<char,void(*)(void*)>::unique_ptr<void(*)(void*),void>
            ((unique_ptr<char,void(*)(void*)> *)local_40,__p,&local_48);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_40);
  if (bVar1) {
    local_78 = std::unique_ptr<char,_void_(*)(void_*)>::get
                         ((unique_ptr<char,_void_(*)(void_*)> *)local_40);
  }
  else {
    local_78 = std::type_info::name((type_info *)local_18);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (__return_storage_ptr__,local_78);
  local_19 = 1;
  std::unique_ptr<char,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<char,_void_(*)(void_*)> *)local_40);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Suite::toPrettyTypeName(const std::type_info &type) {
  // Adapted from Howard Hinnants's implementation in http://stackoverflow.com/a/18369732
  std::string result = type.name();
#if defined(__GNUG__) || defined(__clang__)
  std::unique_ptr<char, void (*)(void *)> owner{abi::__cxa_demangle(type.name(), nullptr, nullptr, nullptr), std::free};
  result = owner ? owner.get() : type.name();
#endif
  return result;
}